

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_intercept.cpp
# Opt level: O0

void duckdb::RegrInterceptOperation::Finalize<double,duckdb::RegrInterceptState>
               (RegrInterceptState *state,double *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  double *in_RSI;
  long *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double y_avg;
  double x_avg;
  AggregateFinalizeData *in_stack_00000040;
  double *in_stack_00000048;
  RegrSlopeState *in_stack_00000050;
  
  if (*in_RDI == 0) {
    AggregateFinalizeData::ReturnNull((AggregateFinalizeData *)state);
  }
  else {
    RegrSlopeOperation::Finalize<double,duckdb::RegrSlopeState>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040);
    bVar3 = Value::IsNan<double>(1.58493823442238e-316);
    if (bVar3) {
      AggregateFinalizeData::ReturnNull((AggregateFinalizeData *)state);
    }
    else {
      lVar1 = *in_RDI;
      auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar4._0_8_ = lVar1;
      auVar4._12_4_ = 0x45300000;
      lVar2 = *in_RDI;
      auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar5._0_8_ = lVar2;
      auVar5._12_4_ = 0x45300000;
      *in_RSI = -*in_RSI *
                ((double)in_RDI[1] /
                ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) +
                (double)in_RDI[2] /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
			return;
		}
		RegrSlopeOperation::Finalize<T, RegrSlopeState>(state.slope, target, finalize_data);
		if (Value::IsNan(target)) {
			finalize_data.ReturnNull();
			return;
		}
		auto x_avg = state.sum_x / state.count;
		auto y_avg = state.sum_y / state.count;
		target = y_avg - target * x_avg;
	}